

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2connection.cpp
# Opt level: O3

QHttp2Connection *
QHttp2Connection::createUpgradedConnection(QIODevice *socket,QHttp2Configuration *config)

{
  QHttp2Connection *this;
  QHttp2Stream *this_00;
  char extraout_DL;
  QHttp2Connection *this_01;
  long in_FS_OFFSET;
  QHttp2Configuration QStack_28;
  long local_20;
  
  this_01 = (QHttp2Connection *)&QStack_28;
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this = (QHttp2Connection *)operator_new(0x2b8);
  QHttp2Connection((QHttp2Connection *)this,socket);
  QHttp2Configuration::QHttp2Configuration(&QStack_28,config);
  setH2Configuration((QHttp2Connection *)this,(QHttp2Configuration)&QStack_28);
  QHttp2Configuration::~QHttp2Configuration(&QStack_28);
  this->m_connectionType = Client;
  this->m_upgradedConnection = true;
  this_00 = (QHttp2Stream *)
            createLocalStreamInternal
                      ((QH2Expected<QHttp2Stream_*,_QHttp2Connection::CreateStreamError> *)this,
                       this_01);
  if (extraout_DL != '\0') {
    abort();
  }
  QHttp2Stream::setState(this_00,HalfClosedLocal);
  if (this->m_prefaceSent == false) {
    (**(code **)(*(long *)this + 0x20))(this);
    this = (QHttp2Connection *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QHttp2Connection *QHttp2Connection::createUpgradedConnection(QIODevice *socket,
                                                             const QHttp2Configuration &config)
{
    Q_ASSERT(socket);

    auto connection = std::unique_ptr<QHttp2Connection>(new QHttp2Connection(socket));
    connection->setH2Configuration(config);
    connection->m_connectionType = QHttp2Connection::Type::Client;
    connection->m_upgradedConnection = true;
    // HTTP2 connection is already established and request was sent, so stream 1
    // is already 'active' and is closed for any further outgoing data.
    QHttp2Stream *stream = connection->createLocalStreamInternal().unwrap();
    Q_ASSERT(stream->streamID() == 1);
    stream->setState(QHttp2Stream::State::HalfClosedLocal);

    if (!connection->m_prefaceSent) // Preface is sent as part of initial stream-creation.
        return nullptr;

    return connection.release();
}